

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedBindingUpdate::Run(AdvancedBindingUpdate *this)

{
  GLubyte *pGVar1;
  bool bVar2;
  GLuint GVar3;
  GLuint shader;
  GLint GVar4;
  long lVar5;
  Vector<float,_3> local_150;
  Vector<float,_3> local_144;
  Vector<float,_3> local_138;
  Vector<float,_3> local_12c;
  uint local_120;
  GLuint i_3;
  Vector<float,_3> local_110;
  byte local_101;
  GLuint local_100;
  uint uStack_fc;
  bool status;
  GLuint ppo;
  GLuint i_2;
  GLuint data_1 [4];
  undefined8 local_e0;
  GLushort data [4];
  Vector<unsigned_int,_3> local_d0;
  Vector<float,_2> local_c4;
  int local_bc;
  Vector<float,_2> VStack_b8;
  int i_1;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  void *local_98;
  GLubyte *ptr_1;
  Vector<unsigned_int,_3> local_88;
  Vector<float,_2> local_7c;
  int local_74;
  Vector<float,_2> VStack_70;
  int i;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  void *local_50;
  GLubyte *ptr;
  GLintptr kOffset [2];
  GLsizei kStride [2];
  GLuint fsh;
  GLuint sh;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedBindingUpdate *this_local;
  
  glsl_fs = 
  "#version 310 es\nlayout(location = 0) in vec4 vs_in_position;\nlayout(location = 1) in vec2 vs_in_color_rg;\nlayout(location = 2) in float vs_in_color_b;\nlayout(location = 3) in uvec3 vs_in_data0;\nlayout(location = 4) in ivec2 vs_in_data1;\nout vec2 color_rg;\nout float color_b;\nflat out uvec3 data0;\nflat out ivec2 data1;\nvoid main() {\n  data0 = vs_in_data0;\n  data1 = vs_in_data1;\n  color_b = vs_in_color_b;\n  color_rg = vs_in_color_rg;\n  gl_Position = vs_in_position;\n}"
  ;
  _fsh = 
  "#version 310 es\nprecision highp float;\nprecision highp int;\nin vec2 color_rg;\nin float color_b;\nflat in uvec3 data0;\nflat in ivec2 data1;\nout vec4 fs_out_color;\nuniform uvec3 g_expected_data0;\nuniform ivec2 g_expected_data1;\nvoid main() {\n  fs_out_color = vec4(color_rg, color_b, 1);\n  if (data0 != g_expected_data0) fs_out_color = vec4(1);\n  if (data1 != g_expected_data1) fs_out_color = vec4(1);\n}"
  ;
  glsl_vs = (char *)this;
  if ((this->pipeline & 1U) == 0) {
    GVar3 = glu::CallLogWrapper::glCreateProgram
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    this->m_ppo = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8b31);
    shader = glu::CallLogWrapper::glCreateShader
                       (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,1,&glsl_fs,(GLint *)0x0);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader,1,(GLchar **)&fsh,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,GVar3);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,shader);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo);
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_ppo);
    if (!bVar2) {
      this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  else {
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8b31,1,&glsl_fs);
    this->m_vsp = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8b30,1,(GLchar **)&fsh);
    this->m_fsp = GVar3;
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
    if ((!bVar2) ||
       (bVar2 = VertexAttribBindingBase::CheckProgram
                          (&this->super_VertexAttribBindingBase,this->m_fsp), !bVar2)) {
      this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,2,this->m_fsp);
  }
  kOffset[1] = 0x4000000034;
  ptr = (GLubyte *)0x0;
  kOffset[0] = 8;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,(GLsizeiptr)(ptr + ((int)kOffset[1] << 2)),(void *)0x0,
             0x88e4);
  local_50 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x8892,0,(GLsizeiptr)(ptr + ((int)kOffset[1] << 2)),2)
  ;
  tcu::Vector<float,_2>::Vector(&local_58,-1.0,-1.0);
  *(float (*) [2])((long)local_50 + (long)ptr) = local_58.m_data;
  tcu::Vector<float,_2>::Vector(&local_60,1.0,-1.0);
  *(float (*) [2])((long)local_50 + (long)(ptr + (int)kOffset[1])) = local_60.m_data;
  tcu::Vector<float,_2>::Vector(&local_68,1.0,1.0);
  *(float (*) [2])((long)local_50 + (long)(ptr + ((int)kOffset[1] << 1))) = local_68.m_data;
  tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff90,-1.0,1.0);
  *(float (*) [2])((long)local_50 + (long)(ptr + (int)kOffset[1] * 3)) = VStack_70.m_data;
  for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
    tcu::Vector<float,_2>::Vector(&local_7c,0.0,1.0);
    *(float (*) [2])((long)local_50 + (long)(ptr + (long)(local_74 * (int)kOffset[1]) + 8)) =
         local_7c.m_data;
    pGVar1 = (GLubyte *)((long)local_50 + (long)(ptr + (long)(local_74 * (int)kOffset[1]) + 0x10));
    pGVar1[0] = '\0';
    pGVar1[1] = '\0';
    pGVar1[2] = '\0';
    pGVar1[3] = '\0';
    tcu::Vector<unsigned_int,_3>::Vector(&local_88,1,2,3);
    *(undefined8 *)((long)local_50 + (long)(ptr + (long)(local_74 * (int)kOffset[1]) + 0x14)) =
         local_88.m_data._0_8_;
    *(uint *)(ptr + (long)(local_74 * (int)kOffset[1]) + 0x14 + (long)local_50 + 8) =
         local_88.m_data[2];
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&ptr_1,1,2);
    *(GLubyte **)((long)local_50 + (long)(ptr + (long)(local_74 * (int)kOffset[1]) + 0x2c)) = ptr_1;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,kOffset[0] + (kOffset[1]._4_4_ << 2),(void *)0x0,0x88e4);
  local_98 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x8892,0,kOffset[0] + (kOffset[1]._4_4_ << 2),2);
  tcu::Vector<float,_2>::Vector(&local_a0,-1.0,1.0);
  *(float (*) [2])((long)local_98 + kOffset[0]) = local_a0.m_data;
  tcu::Vector<float,_2>::Vector(&local_a8,1.0,1.0);
  *(float (*) [2])((long)local_98 + kOffset[0] + kOffset[1]._4_4_) = local_a8.m_data;
  tcu::Vector<float,_2>::Vector(&local_b0,1.0,-1.0);
  *(float (*) [2])((long)local_98 + kOffset[0] + (kOffset[1]._4_4_ << 1)) = local_b0.m_data;
  tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff48,-1.0,-1.0);
  *(float (*) [2])((long)local_98 + kOffset[0] + kOffset[1]._4_4_ * 3) = VStack_b8.m_data;
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    tcu::Vector<float,_2>::Vector(&local_c4,0.0,0.0);
    *(float (*) [2])((long)local_98 + kOffset[0] + 8 + (long)(local_bc * kOffset[1]._4_4_)) =
         local_c4.m_data;
    *(undefined4 *)((long)local_98 + kOffset[0] + 0x10 + (long)(local_bc * kOffset[1]._4_4_)) =
         0x3f800000;
    tcu::Vector<unsigned_int,_3>::Vector(&local_d0,4,5,6);
    lVar5 = kOffset[0] + 0x14 + (long)(local_bc * kOffset[1]._4_4_);
    *(undefined8 *)((long)local_98 + lVar5) = local_d0.m_data._0_8_;
    *(uint *)((long)local_98 + lVar5 + 8) = local_d0.m_data[2];
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)data,3,4);
    *(GLushort (*) [4])((long)local_98 + kOffset[0] + 0x2c + (long)(local_bc * kOffset[1]._4_4_)) =
         data;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,this->m_ebo[0]);
  local_e0 = 0x2000300010000;
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,8,&local_e0,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,this->m_ebo[1]);
  _ppo = 0x200000003;
  data_1[0] = 0;
  data_1[1] = 1;
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,0x10,&ppo,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao[0]);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,2,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,1,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,3,0x1405,0x14);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,2,0x1404,0x2c);
  for (uStack_fc = 0; uStack_fc < 5; uStack_fc = uStack_fc + 1) {
    glu::CallLogWrapper::glVertexAttribBinding
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,uStack_fc,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,uStack_fc);
  }
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao[1]);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,2,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,1,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,3,0x1405,0x14);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,2,0x1404,0x2c);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,8);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,8);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,this->m_vbo[1],kOffset[0],kOffset[1]._4_4_);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,8,this->m_vbo[0],(GLintptr)ptr,(int)kOffset[1]);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,this->m_ebo[1]);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glClear
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  if ((this->pipeline & 1U) == 0) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo);
    local_100 = this->m_ppo;
  }
  else {
    glu::CallLogWrapper::glBindProgramPipeline
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo);
    local_100 = this->m_fsp;
  }
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao[0]);
  GVar3 = local_100;
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_100,"g_expected_data0");
  glu::CallLogWrapper::glProgramUniform3ui
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar3,GVar4,1,2,3);
  GVar3 = local_100;
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_100,"g_expected_data1");
  glu::CallLogWrapper::glProgramUniform2i
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar3,GVar4,1,2);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,this->m_vbo[0],(GLintptr)ptr,(int)kOffset[1]);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8893,this->m_ebo[0]);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,4,0x1403,(void *)0x0,1);
  local_101 = 1;
  tcu::Vector<float,_3>::Vector(&local_110,0.0,1.0,0.0);
  bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_110);
  GVar3 = local_100;
  if (!bVar2) {
    local_101 = 0;
  }
  if ((local_101 & 1) == 0) {
    this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
  }
  else {
    GVar4 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,local_100,"g_expected_data0");
    glu::CallLogWrapper::glProgramUniform3ui
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,GVar4,4,5,6);
    GVar3 = local_100;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,local_100,"g_expected_data1");
    glu::CallLogWrapper::glProgramUniform2i
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,GVar4,3,4);
    glu::CallLogWrapper::glBindVertexBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_vbo[1],kOffset[0],kOffset[1]._4_4_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->m_ebo[1]);
    glu::CallLogWrapper::glDrawElementsInstanced
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,4,0x1405,(void *)0x0,1);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffee4,0.0,0.0,1.0);
    bVar2 = VertexAttribBindingBase::CheckFB
                      (&this->super_VertexAttribBindingBase,(Vec3 *)&stack0xfffffffffffffee4);
    if (!bVar2) {
      local_101 = 0;
    }
    if ((local_101 & 1) == 0) {
      this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
    }
    else {
      glu::CallLogWrapper::glBindVertexBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,0,0);
      GVar3 = local_100;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,local_100,"g_expected_data0");
      glu::CallLogWrapper::glProgramUniform3ui
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,GVar4,1,2,3);
      GVar3 = local_100;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,local_100,"g_expected_data1");
      glu::CallLogWrapper::glProgramUniform2i
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,GVar4,1,2);
      for (local_120 = 0; local_120 < 5; local_120 = local_120 + 1) {
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,local_120,0xf);
      }
      glu::CallLogWrapper::glBindVertexBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xf,this->m_vbo[0],(GLintptr)ptr,(int)kOffset[1]);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,this->m_ebo[0]);
      glu::CallLogWrapper::glDrawElementsInstanced
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,4,0x1403,(void *)0x0,1);
      tcu::Vector<float,_3>::Vector(&local_12c,0.0,1.0,0.0);
      bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_12c);
      if (!bVar2) {
        local_101 = 0;
      }
      if ((local_101 & 1) == 0) {
        this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
      }
      else {
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xf,0,0,0);
        GVar3 = local_100;
        GVar4 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,local_100,"g_expected_data0");
        glu::CallLogWrapper::glProgramUniform3ui
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,GVar4,1,2,3);
        GVar3 = local_100;
        GVar4 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,local_100,"g_expected_data1");
        glu::CallLogWrapper::glProgramUniform2i
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,GVar4,3,4);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,7,this->m_vbo[0],(GLintptr)ptr,(int)kOffset[1]);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xc,this->m_vbo[1],kOffset[0],kOffset[1]._4_4_);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,7);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,0xc);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,0xc);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,3,7);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,4,0xc);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,this->m_ebo[0]);
        glu::CallLogWrapper::glDrawElementsInstanced
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,4,0x1403,(void *)0x0,1);
        tcu::Vector<float,_3>::Vector(&local_138,0.0,0.0,1.0);
        bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_138);
        if (!bVar2) {
          local_101 = 0;
        }
        if ((local_101 & 1) == 0) {
          this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
        }
        else {
          glu::CallLogWrapper::glClear
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x4000);
          GVar3 = local_100;
          GVar4 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,local_100,"g_expected_data1");
          glu::CallLogWrapper::glProgramUniform2i
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar3,GVar4,0,0);
          glu::CallLogWrapper::glDisableVertexAttribArray
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,4);
          glu::CallLogWrapper::glVertexAttribI4i
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,4,0,0,0,0);
          glu::CallLogWrapper::glDrawElementsInstanced
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,5,4,0x1403,(void *)0x0,1);
          tcu::Vector<float,_3>::Vector(&local_144,0.0,0.0,1.0);
          bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_144);
          GVar3 = local_100;
          if (!bVar2) {
            local_101 = 0;
          }
          if ((local_101 & 1) == 0) {
            this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
          }
          else {
            GVar4 = glu::CallLogWrapper::glGetUniformLocation
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,local_100,"g_expected_data0");
            glu::CallLogWrapper::glProgramUniform3ui
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,GVar3,GVar4,4,5,6);
            GVar3 = local_100;
            GVar4 = glu::CallLogWrapper::glGetUniformLocation
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,local_100,"g_expected_data1");
            glu::CallLogWrapper::glProgramUniform2i
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,GVar3,GVar4,1,2);
            glu::CallLogWrapper::glBindVertexArray
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_vao[1]);
            glu::CallLogWrapper::glDrawElementsInstanced
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,5,4,0x1405,(void *)0x0,1);
            tcu::Vector<float,_3>::Vector(&local_150,0.0,1.0,1.0);
            bVar2 = VertexAttribBindingBase::CheckFB
                              (&this->super_VertexAttribBindingBase,&local_150);
            if (!bVar2) {
              local_101 = 0;
            }
            if ((local_101 & 1) == 0) {
              this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
            }
            else {
              this_local = (AdvancedBindingUpdate *)0x0;
            }
          }
        }
      }
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 310 es" NL "layout(location = 0) in vec4 vs_in_position;" NL
			"layout(location = 1) in vec2 vs_in_color_rg;" NL "layout(location = 2) in float vs_in_color_b;" NL
			"layout(location = 3) in uvec3 vs_in_data0;" NL "layout(location = 4) in ivec2 vs_in_data1;" NL
			"out vec2 color_rg;" NL "out float color_b;" NL "flat out uvec3 data0;" NL "flat out ivec2 data1;" NL
			"void main() {" NL "  data0 = vs_in_data0;" NL "  data1 = vs_in_data1;" NL "  color_b = vs_in_color_b;" NL
			"  color_rg = vs_in_color_rg;" NL "  gl_Position = vs_in_position;" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "precision highp float;" NL "precision highp int;" NL "in vec2 color_rg;" NL
			"in float color_b;" NL "flat in uvec3 data0;" NL "flat in ivec2 data1;" NL "out vec4 fs_out_color;" NL
			"uniform uvec3 g_expected_data0;" NL "uniform ivec2 g_expected_data1;" NL "void main() {" NL
			"  fs_out_color = vec4(color_rg, color_b, 1);" NL
			"  if (data0 != g_expected_data0) fs_out_color = vec4(1);" NL
			"  if (data1 != g_expected_data1) fs_out_color = vec4(1);" NL "}";
		if (pipeline)
		{
			m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
				return ERROR;
			glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);
		}
		else
		{
			m_ppo			 = glCreateProgram();
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_ppo, sh);
			glAttachShader(m_ppo, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
			glLinkProgram(m_ppo);
			if (!CheckProgram(m_ppo))
				return ERROR;
		}

		const GLsizei  kStride[2] = { 52, 64 };
		const GLintptr kOffset[2] = { 0, 8 };
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		/* first VBO */
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[0] + 4 * kStride[0], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_ARRAY_BUFFER, 0, kOffset[0] + 4 * kStride[0], GL_MAP_WRITE_BIT));
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 0 * kStride[0]]) = Vec2(-1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 1 * kStride[0]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 2 * kStride[0]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 3 * kStride[0]]) = Vec2(-1.0f, 1.0f);
			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 8 + i * kStride[0]])   = Vec2(0.0f, 1.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[0] + 16 + i * kStride[0]]) = 0.0f;
				*reinterpret_cast<UVec3*>(&ptr[kOffset[0] + 20 + i * kStride[0]]) = UVec3(1, 2, 3);
				*reinterpret_cast<IVec2*>(&ptr[kOffset[0] + 44 + i * kStride[0]]) = IVec2(1, 2);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		/* second VBO */
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[1] + 4 * kStride[1], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_ARRAY_BUFFER, 0, kOffset[1] + 4 * kStride[1], GL_MAP_WRITE_BIT));
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 0 * kStride[1]]) = Vec2(-1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 1 * kStride[1]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 2 * kStride[1]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 3 * kStride[1]]) = Vec2(-1.0f, -1.0f);
			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 8 + i * kStride[1]])   = Vec2(0.0f, 0.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[1] + 16 + i * kStride[1]]) = 1.0f;
				*reinterpret_cast<UVec3*>(&ptr[kOffset[1] + 20 + i * kStride[1]]) = UVec3(4, 5, 6);
				*reinterpret_cast<IVec2*>(&ptr[kOffset[1] + 44 + i * kStride[1]]) = IVec2(3, 4);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		/* first EBO */
		{
			GLushort data[4] = { 0, 1, 3, 2 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		/* second EBO */
		{
			GLuint data[4] = { 3, 2, 0, 1 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(3, 3, GL_UNSIGNED_INT, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		for (GLuint i = 0; i < 5; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexArray(m_vao[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(3, 3, GL_UNSIGNED_INT, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		glVertexAttribBinding(0, 1);
		glVertexAttribBinding(1, 8);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(3, 1);
		glVertexAttribBinding(4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(1, m_vbo[1], kOffset[1], kStride[1]);
		glBindVertexBuffer(8, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		GLuint ppo;
		if (pipeline)
		{
			glBindProgramPipeline(m_ppo);
			ppo = m_fsp;
		}
		else
		{
			glUseProgram(m_ppo);
			ppo = m_ppo;
		}
		glBindVertexArray(m_vao[0]);

		// Bind first VBO
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);
		glBindVertexBuffer(0, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		bool status = true;
		if (!CheckFB(Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		// Bind second VBO (change all vertex attribs with one call)
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 4, 5, 6);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(0, m_vbo[1], kOffset[1], kStride[1]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Change attrib bindings (all attribs from one buffer)
		glBindVertexBuffer(0, 0, 0, 0); // "unbind" buffer

		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);

		for (GLuint i = 0; i < 5; ++i)
			glVertexAttribBinding(i, 15);
		glBindVertexBuffer(15, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		// Change attrib bindings (attribs from two buffers)
		glBindVertexBuffer(15, 0, 0, 0); // "unbind" buffer

		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(7, m_vbo[0], kOffset[0], kStride[0]);
		glBindVertexBuffer(12, m_vbo[1], kOffset[1], kStride[1]);
		glVertexAttribBinding(0, 7);
		glVertexAttribBinding(1, 12);
		glVertexAttribBinding(2, 12);
		glVertexAttribBinding(3, 7);
		glVertexAttribBinding(4, 12);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Disable one of the attribs
		glClear(GL_COLOR_BUFFER_BIT);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 0, 0);
		glDisableVertexAttribArray(4);
		glVertexAttribI4i(4, 0, 0, 0, 0);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Change VAO
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 4, 5, 6);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);

		glBindVertexArray(m_vao[1]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1);

		if (!CheckFB(Vec3(0, 1, 1)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}